

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

bool_t ArrayInsert(array *p,size_t Ofs,void *Ptr,size_t Width,size_t Align)

{
  char *pcVar1;
  char *pcVar2;
  bool_t bVar3;
  size_t sVar4;
  size_t Align_local;
  size_t Width_local;
  void *Ptr_local;
  size_t Ofs_local;
  array *p_local;
  
  bVar3 = ArrayAppend(p,(void *)0x0,Width,Align);
  if (bVar3 == 0) {
    p_local = (array *)0x0;
  }
  else {
    if (p == (array *)0x0) {
      __assert_fail("&(*p)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                    ,0xcb,"bool_t ArrayInsert(array *, size_t, const void *, size_t, size_t)");
    }
    pcVar1 = p->_Begin;
    if (p == (array *)0x0) {
      __assert_fail("&(*p)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                    ,0xcb,"bool_t ArrayInsert(array *, size_t, const void *, size_t, size_t)");
    }
    pcVar2 = p->_Begin;
    sVar4 = ArraySize(p);
    memmove(pcVar1 + Width + Ofs,pcVar2 + Ofs,(sVar4 - Width) - Ofs);
    if (Ptr != (void *)0x0) {
      if (p == (array *)0x0) {
        __assert_fail("&(*p)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                      ,0xcd,"bool_t ArrayInsert(array *, size_t, const void *, size_t, size_t)");
      }
      memcpy(p->_Begin + Ofs,Ptr,Width);
    }
    p_local = (array *)0x1;
  }
  return (bool_t)p_local;
}

Assistant:

bool_t ArrayInsert(array* p, size_t Ofs, const void* Ptr, size_t Width, size_t Align)
{
    if (!ArrayAppend(p,NULL,Width,Align))
        return 0;
    memmove(ARRAYBEGIN(*p,uint8_t)+Ofs+Width, ARRAYBEGIN(*p,uint8_t)+Ofs, ArraySize(p)-Width-Ofs);
    if (Ptr)
        memcpy(ARRAYBEGIN(*p,uint8_t)+Ofs, Ptr, Width);
    return 1;
}